

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int LongestStringMask2(char *zString,int nLen,char *zMask,int nMaskLen)

{
  int local_3c;
  int c;
  int i;
  char *zIn;
  char *zEnd;
  int nMaskLen_local;
  char *zMask_local;
  char *pcStack_10;
  int nLen_local;
  char *zString_local;
  
  for (pcStack_10 = zString; pcStack_10 < zString + nLen; pcStack_10 = pcStack_10 + 1) {
    for (local_3c = 0; (local_3c < nMaskLen && (*pcStack_10 != zMask[local_3c]));
        local_3c = local_3c + 1) {
    }
    if (local_3c < nMaskLen) break;
  }
  return (int)pcStack_10 - (int)zString;
}

Assistant:

static int LongestStringMask2(const char *zString, int nLen, const char *zMask, int nMaskLen)
{
	const char *zEnd = &zString[nLen];
	const char *zIn = zString;
	int i, c;
	for(;;){
		if( zString >= zEnd ){
			break;
		}
		/* Extract current character */
		c = zString[0];
		/* Perform the lookup */
		for( i = 0 ; i < nMaskLen ; i++ ){
			if( c == zMask[i] ){
				break;
			}
		}
		if( i < nMaskLen ){
			/* Character in the current mask, break immediately */
			break;
		}
		/* Advance cursor */
		zString++;
	}
	/* Longest match */
	return (int)(zString-zIn);
}